

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ieee.h
# Opt level: O0

DiyFp __thiscall FIX::double_conversion::Double::AsNormalizedDiyFp(Double *this)

{
  double dVar1;
  DiyFp DVar2;
  int local_2c;
  uint64_t uStack_28;
  int e;
  uint64_t f;
  Double *this_local;
  undefined4 local_10;
  
  dVar1 = value(this);
  if (0.0 < dVar1) {
    uStack_28 = Significand(this);
    local_2c = Exponent(this);
    for (; (uStack_28 & 0x10000000000000) == 0; uStack_28 = uStack_28 << 1) {
      local_2c = local_2c + -1;
    }
    DiyFp::DiyFp((DiyFp *)&this_local,uStack_28 << 0xb,local_2c + -0xb);
    DVar2._12_4_ = 0;
    DVar2.f_ = (uint64_t)this_local;
    DVar2.e_ = local_10;
    return DVar2;
  }
  __assert_fail("value() > 0.0",
                "/workspace/llm4binary/github/license_c_cmakelists/quickfix[P]quickfix/src/C++/double-conversion/ieee.h"
                ,0x43,"DiyFp FIX::double_conversion::Double::AsNormalizedDiyFp() const");
}

Assistant:

DiyFp AsNormalizedDiyFp() const {
    ASSERT(value() > 0.0);
    uint64_t f = Significand();
    int e = Exponent();

    // The current double could be a denormal.
    while ((f & kHiddenBit) == 0) {
      f <<= 1;
      e--;
    }
    // Do the final shifts in one go.
    f <<= DiyFp::kSignificandSize - kSignificandSize;
    e -= DiyFp::kSignificandSize - kSignificandSize;
    return DiyFp(f, e);
  }